

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O0

void __thiscall HEkkPrimal::basicFeasibilityChangeUpdateDual(HEkkPrimal *this)

{
  double dVar1;
  long lVar2;
  bool bVar3;
  reference pvVar4;
  reference pvVar5;
  long *in_RDI;
  HEkkPrimal *unaff_retaddr;
  HighsInt iCol_1;
  HighsInt iRow;
  HighsInt iEntry_1;
  bool use_col_indices;
  HighsInt iCol;
  HighsInt iEntry;
  bool use_row_indices;
  HighsInt to_entry;
  HighsSimplexInfo *info;
  int local_4c;
  value_type in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  value_type vVar6;
  int local_28;
  int local_1c;
  int local_14;
  long local_10;
  
  HighsSimplexAnalysis::simplexTimerStart
            ((HighsSimplexAnalysis *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (HighsInt)((ulong)in_stack_ffffffffffffffb8 >> 0x20),SUB84(in_stack_ffffffffffffffb8,0)
            );
  local_10 = *in_RDI + 0x2560;
  basicFeasibilityChangeBtran
            ((HEkkPrimal *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  basicFeasibilityChangePrice(unaff_retaddr);
  bVar3 = HSimplexNla::sparseLoopStyle
                    ((HSimplexNla *)(*in_RDI + 0x2b38),*(HighsInt *)((long)in_RDI + 0x4bc),
                     (HighsInt)in_RDI[2],&local_14);
  for (local_1c = 0; local_1c < local_14; local_1c = local_1c + 1) {
    vVar6 = local_1c;
    if (bVar3) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x98),(long)local_1c);
      vVar6 = *pvVar4;
    }
    in_stack_ffffffffffffffc4 = vVar6;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x9b),(long)vVar6);
    in_stack_ffffffffffffffb8 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_10 + 0x18),(long)vVar6);
    *pvVar5 = *pvVar5 - in_stack_ffffffffffffffb8;
  }
  bVar3 = HSimplexNla::sparseLoopStyle
                    ((HSimplexNla *)(*in_RDI + 0x2b38),*(HighsInt *)((long)in_RDI + 0x40c),
                     *(HighsInt *)((long)in_RDI + 0x14),&local_14);
  for (local_28 = 0; local_28 < local_14; local_28 = local_28 + 1) {
    if (bVar3) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x82),(long)local_28);
      local_4c = *pvVar4;
    }
    else {
      local_4c = local_28;
    }
    lVar2 = in_RDI[2];
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x85),(long)local_4c);
    dVar1 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_10 + 0x18),
                        (long)((int)lVar2 + local_4c));
    *pvVar5 = *pvVar5 - dVar1;
  }
  HEkk::invalidateDualInfeasibilityRecord((HEkk *)0x7ad61b);
  HighsSimplexAnalysis::simplexTimerStop
            ((HighsSimplexAnalysis *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (HighsInt)((ulong)in_stack_ffffffffffffffb8 >> 0x20),SUB84(in_stack_ffffffffffffffb8,0)
            );
  return;
}

Assistant:

void HEkkPrimal::basicFeasibilityChangeUpdateDual() {
  analysis->simplexTimerStart(UpdateDualBasicFeasibilityChangeClock);
  HighsSimplexInfo& info = ekk_instance_.info_;
  // For basic logicals, the change in the basic cost will be a
  // component in col_basic_feasibility_change. This will lead to it being
  // subtracted from workDual in the loop below over the
  // nonzeros in col_basic_feasibility_change, so add it in now. For basic
  // structurals, there will be no corresponding component in
  // row_basic_feasibility_change, since only the nonbasic components are
  // computed (avoided using row pricing, and basic components
  // zeroed after column pricing). Hence there will be no
  // subtraction in the loop below over the nonzeros in
  // row_basic_feasibility_change. Hence, only add in the basic cost change
  // for logicals.
  //
  // Assumes that row_basic_feasibility_change has been set up in
  // phase1UpdatePrimal()

  basicFeasibilityChangeBtran();
  basicFeasibilityChangePrice();
  HighsInt to_entry;
  const bool use_row_indices = ekk_instance_.simplex_nla_.sparseLoopStyle(
      row_basic_feasibility_change.count, num_col, to_entry);
  for (HighsInt iEntry = 0; iEntry < to_entry; iEntry++) {
    const HighsInt iCol =
        use_row_indices ? row_basic_feasibility_change.index[iEntry] : iEntry;
    info.workDual_[iCol] -= row_basic_feasibility_change.array[iCol];
  }
  const bool use_col_indices = ekk_instance_.simplex_nla_.sparseLoopStyle(
      col_basic_feasibility_change.count, num_row, to_entry);
  for (HighsInt iEntry = 0; iEntry < to_entry; iEntry++) {
    const HighsInt iRow =
        use_col_indices ? col_basic_feasibility_change.index[iEntry] : iEntry;
    HighsInt iCol = num_col + iRow;
    info.workDual_[iCol] -= col_basic_feasibility_change.array[iRow];
  }
  ekk_instance_.invalidateDualInfeasibilityRecord();
  analysis->simplexTimerStop(UpdateDualBasicFeasibilityChangeClock);
}